

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_binls(void)

{
  uint32_t uVar1;
  int iVar2;
  ptrdiff_t pVar3;
  char *pcVar4;
  char *d;
  ptrdiff_t sz;
  char *local_138;
  char *d2_12;
  char *d1_12;
  char *local_120;
  char *d2_11;
  char *d1_11;
  char *local_108;
  char *d2_10;
  char *d1_10;
  char *local_f0;
  char *d2_9;
  char *d1_9;
  char *local_d8;
  char *d2_8;
  char *d1_8;
  char *local_c0;
  char *d2_7;
  char *d1_7;
  char *local_a8;
  char *d2_6;
  char *d1_6;
  char *local_90;
  char *d2_5;
  char *d1_5;
  char *local_78;
  char *d2_4;
  char *d1_4;
  char *local_60;
  char *d2_3;
  char *d1_3;
  char *local_48;
  char *d2_2;
  char *d1_2;
  char *local_30;
  char *d2_1;
  char *d1_1;
  char *local_18;
  char *d2;
  char *d1;
  
  _plan(0x57,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n");
  d2 = mp_encode_binl(data,0);
  local_18 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0x00U");
  d1_1._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d2,
      "mp_check_binl(0x00U) == 0");
  uVar1 = mp_decode_binl(&local_18);
  _ok((uint)(uVar1 == 0),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x00U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d2,
      "mp_decode(mp_encode(0x00U)) == 0x00U");
  _ok((uint)((long)d2 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d2,
      "len(mp_encode_binl(0x00U)");
  _ok((uint)(d2 == local_18),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d2,
      "len(mp_decode_binl(0x00U))");
  uVar1 = mp_sizeof_binl(0);
  _ok((uint)(uVar1 == 2),"mp_sizeof_binl(0x00U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d2,
      "mp_sizeof_binl(0x00U)");
  _ok((uint)(*(short *)data == 0xc4),"memcmp(data, (\"\\xc4\\x00\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d2,
      "mp_encode(0x00U) == \"\\xc4\\x00\"");
  d2_1 = mp_encode_binl(data,1);
  local_30 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0x01U");
  d1_2._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_1);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d3,
      "mp_check_binl(0x01U) == 0");
  uVar1 = mp_decode_binl(&local_30);
  _ok((uint)(uVar1 == 1),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x01U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d3,
      "mp_decode(mp_encode(0x01U)) == 0x01U");
  _ok((uint)((long)d2_1 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d3,
      "len(mp_encode_binl(0x01U)");
  _ok((uint)(d2_1 == local_30),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d3,
      "len(mp_decode_binl(0x01U))");
  uVar1 = mp_sizeof_binl(1);
  _ok((uint)(uVar1 == 2),"mp_sizeof_binl(0x01U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d3,
      "mp_sizeof_binl(0x01U)");
  _ok((uint)(*(short *)data == 0x1c4),"memcmp(data, (\"\\xc4\\x01\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d3,
      "mp_encode(0x01U) == \"\\xc4\\x01\"");
  d2_2 = mp_encode_binl(data,0x1e);
  local_48 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0x1eU");
  d1_3._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_2);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d4,
      "mp_check_binl(0x1eU) == 0");
  uVar1 = mp_decode_binl(&local_48);
  _ok((uint)(uVar1 == 0x1e),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x1eU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d4,
      "mp_decode(mp_encode(0x1eU)) == 0x1eU");
  _ok((uint)((long)d2_2 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d4,
      "len(mp_encode_binl(0x1eU)");
  _ok((uint)(d2_2 == local_48),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d4,
      "len(mp_decode_binl(0x1eU))");
  uVar1 = mp_sizeof_binl(0x1e);
  _ok((uint)(uVar1 == 2),"mp_sizeof_binl(0x1eU) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d4,
      "mp_sizeof_binl(0x1eU)");
  _ok((uint)(*(short *)data == 0x1ec4),"memcmp(data, (\"\\xc4\\x1e\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d4,
      "mp_encode(0x1eU) == \"\\xc4\\x1e\"");
  d2_3 = mp_encode_binl(data,0x1f);
  local_60 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0x1fU");
  d1_4._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_3);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d5,
      "mp_check_binl(0x1fU) == 0");
  uVar1 = mp_decode_binl(&local_60);
  _ok((uint)(uVar1 == 0x1f),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x1fU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d5,
      "mp_decode(mp_encode(0x1fU)) == 0x1fU");
  _ok((uint)((long)d2_3 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d5,
      "len(mp_encode_binl(0x1fU)");
  _ok((uint)(d2_3 == local_60),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d5,
      "len(mp_decode_binl(0x1fU))");
  uVar1 = mp_sizeof_binl(0x1f);
  _ok((uint)(uVar1 == 2),"mp_sizeof_binl(0x1fU) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d5,
      "mp_sizeof_binl(0x1fU)");
  _ok((uint)(*(short *)data == 0x1fc4),"memcmp(data, (\"\\xc4\\x1f\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d5,
      "mp_encode(0x1fU) == \"\\xc4\\x1f\"");
  d2_4 = mp_encode_binl(data,0x20);
  local_78 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0x20U");
  d1_5._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_4);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d7,
      "mp_check_binl(0x20U) == 0");
  uVar1 = mp_decode_binl(&local_78);
  _ok((uint)(uVar1 == 0x20),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x20U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d7,
      "mp_decode(mp_encode(0x20U)) == 0x20U");
  _ok((uint)((long)d2_4 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d7,
      "len(mp_encode_binl(0x20U)");
  _ok((uint)(d2_4 == local_78),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d7,
      "len(mp_decode_binl(0x20U))");
  uVar1 = mp_sizeof_binl(0x20);
  _ok((uint)(uVar1 == 2),"mp_sizeof_binl(0x20U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d7,
      "mp_sizeof_binl(0x20U)");
  _ok((uint)(*(short *)data == 0x20c4),"memcmp(data, (\"\\xc4\\x20\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d7,
      "mp_encode(0x20U) == \"\\xc4\\x20\"");
  d2_5 = mp_encode_binl(data,0xfe);
  local_90 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0xfeU");
  d1_6._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_5);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d8,
      "mp_check_binl(0xfeU) == 0");
  uVar1 = mp_decode_binl(&local_90);
  _ok((uint)(uVar1 == 0xfe),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xfeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d8,
      "mp_decode(mp_encode(0xfeU)) == 0xfeU");
  _ok((uint)((long)d2_5 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d8,
      "len(mp_encode_binl(0xfeU)");
  _ok((uint)(d2_5 == local_90),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d8,
      "len(mp_decode_binl(0xfeU))");
  uVar1 = mp_sizeof_binl(0xfe);
  _ok((uint)(uVar1 == 2),"mp_sizeof_binl(0xfeU) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d8,
      "mp_sizeof_binl(0xfeU)");
  _ok((uint)(*(short *)data == -0x13c),"memcmp(data, (\"\\xc4\\xfe\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d8,
      "mp_encode(0xfeU) == \"\\xc4\\xfe\"");
  d2_6 = mp_encode_binl(data,0xff);
  local_a8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0xffU");
  d1_7._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_6);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d9,
      "mp_check_binl(0xffU) == 0");
  uVar1 = mp_decode_binl(&local_a8);
  _ok((uint)(uVar1 == 0xff),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d9,
      "mp_decode(mp_encode(0xffU)) == 0xffU");
  _ok((uint)((long)d2_6 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d9,
      "len(mp_encode_binl(0xffU)");
  _ok((uint)(d2_6 == local_a8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d9,
      "len(mp_decode_binl(0xffU))");
  uVar1 = mp_sizeof_binl(0xff);
  _ok((uint)(uVar1 == 2),"mp_sizeof_binl(0xffU) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d9,
      "mp_sizeof_binl(0xffU)");
  _ok((uint)(*(short *)data == -0x3c),"memcmp(data, (\"\\xc4\\xff\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1d9,
      "mp_encode(0xffU) == \"\\xc4\\xff\"");
  d2_7 = mp_encode_binl(data,0x100);
  local_c0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0x0100U");
  d1_8._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_7);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1db,
      "mp_check_binl(0x0100U) == 0");
  uVar1 = mp_decode_binl(&local_c0);
  _ok((uint)(uVar1 == 0x100),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x0100U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1db,
      "mp_decode(mp_encode(0x0100U)) == 0x0100U");
  _ok((uint)((long)d2_7 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1db,
      "len(mp_encode_binl(0x0100U)");
  _ok((uint)(d2_7 == local_c0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1db,
      "len(mp_decode_binl(0x0100U))");
  uVar1 = mp_sizeof_binl(0x100);
  _ok((uint)(uVar1 == 3),"mp_sizeof_binl(0x0100U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1db,
      "mp_sizeof_binl(0x0100U)");
  iVar2 = memcmp(data,anon_var_dwarf_3cf7,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc5\\x01\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1db,
      "mp_encode(0x0100U) == \"\\xc5\\x01\\x00\"");
  d2_8 = mp_encode_binl(data,0xfffe);
  local_d8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0xfffeU");
  d1_9._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_8);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dc,
      "mp_check_binl(0xfffeU) == 0");
  uVar1 = mp_decode_binl(&local_d8);
  _ok((uint)(uVar1 == 0xfffe),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xfffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dc,
      "mp_decode(mp_encode(0xfffeU)) == 0xfffeU");
  _ok((uint)((long)d2_8 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dc,
      "len(mp_encode_binl(0xfffeU)");
  _ok((uint)(d2_8 == local_d8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dc,
      "len(mp_decode_binl(0xfffeU))");
  uVar1 = mp_sizeof_binl(0xfffe);
  _ok((uint)(uVar1 == 3),"mp_sizeof_binl(0xfffeU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dc,
      "mp_sizeof_binl(0xfffeU)");
  iVar2 = memcmp(data,anon_var_dwarf_3d6f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc5\\xff\\xfe\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dc,
      "mp_encode(0xfffeU) == \"\\xc5\\xff\\xfe\"");
  d2_9 = mp_encode_binl(data,0xffff);
  local_f0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0xffffU");
  d1_10._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_9);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dd,
      "mp_check_binl(0xffffU) == 0");
  uVar1 = mp_decode_binl(&local_f0);
  _ok((uint)(uVar1 == 0xffff),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dd,
      "mp_decode(mp_encode(0xffffU)) == 0xffffU");
  _ok((uint)((long)d2_9 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dd,
      "len(mp_encode_binl(0xffffU)");
  _ok((uint)(d2_9 == local_f0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dd,
      "len(mp_decode_binl(0xffffU))");
  uVar1 = mp_sizeof_binl(0xffff);
  _ok((uint)(uVar1 == 3),"mp_sizeof_binl(0xffffU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dd,
      "mp_sizeof_binl(0xffffU)");
  iVar2 = memcmp(data,anon_var_dwarf_3de7,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc5\\xff\\xff\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1dd,
      "mp_encode(0xffffU) == \"\\xc5\\xff\\xff\"");
  d2_10 = mp_encode_binl(data,0x10000);
  local_108 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0x00010000U");
  d1_11._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_10);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1df,
      "mp_check_binl(0x00010000U) == 0");
  uVar1 = mp_decode_binl(&local_108);
  _ok((uint)(uVar1 == 0x10000),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x00010000U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1df,
      "mp_decode(mp_encode(0x00010000U)) == 0x00010000U");
  _ok((uint)((long)d2_10 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1df,
      "len(mp_encode_binl(0x00010000U)");
  _ok((uint)(d2_10 == local_108),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1df,
      "len(mp_decode_binl(0x00010000U))");
  uVar1 = mp_sizeof_binl(0x10000);
  _ok((uint)(uVar1 == 5),"mp_sizeof_binl(0x00010000U) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1df,
      "mp_sizeof_binl(0x00010000U)");
  iVar2 = memcmp(data,anon_var_dwarf_3e5f,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc6\\x00\\x01\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1df,
      "mp_encode(0x00010000U) == \"\\xc6\\x00\\x01\\x00\\x00\"");
  d2_11 = mp_encode_binl(data,0xfffffffe);
  local_120 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0xfffffffeU");
  d1_12._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_11);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e0,
      "mp_check_binl(0xfffffffeU) == 0");
  uVar1 = mp_decode_binl(&local_120);
  _ok((uint)(uVar1 == 0xfffffffe),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xfffffffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e0,
      "mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
  _ok((uint)((long)d2_11 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e0,
      "len(mp_encode_binl(0xfffffffeU)");
  _ok((uint)(d2_11 == local_120),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e0,
      "len(mp_decode_binl(0xfffffffeU))");
  uVar1 = mp_sizeof_binl(0xfffffffe);
  _ok((uint)(uVar1 == 5),"mp_sizeof_binl(0xfffffffeU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e0,
      "mp_sizeof_binl(0xfffffffeU)");
  iVar2 = memcmp(data,anon_var_dwarf_3ed7,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc6\\xff\\xff\\xff\\xfe\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e0,
      "mp_encode(0xfffffffeU) == \"\\xc6\\xff\\xff\\xff\\xfe\"");
  d2_12 = mp_encode_binl(data,0xffffffff);
  local_138 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl 0xffffffffU");
  sz._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_binl(data,d2_12);
  _ok((uint)(pVar3 == 0),"mp_check_binl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e1,
      "mp_check_binl(0xffffffffU) == 0");
  uVar1 = mp_decode_binl(&local_138);
  _ok((uint)(uVar1 == 0xffffffff),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xffffffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e1,
      "mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
  _ok((uint)((long)d2_12 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e1,
      "len(mp_encode_binl(0xffffffffU)");
  _ok((uint)(d2_12 == local_138),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e1,
      "len(mp_decode_binl(0xffffffffU))");
  uVar1 = mp_sizeof_binl(0xffffffff);
  _ok((uint)(uVar1 == 5),"mp_sizeof_binl(0xffffffffU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e1,
      "mp_sizeof_binl(0xffffffffU)");
  iVar2 = memcmp(data,anon_var_dwarf_3f4f,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc6\\xff\\xff\\xff\\xff\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e1,
      "mp_encode(0xffffffffU) == \"\\xc6\\xff\\xff\\xff\\xff\"");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"binl_safe");
  sz._0_4_ = fprintf(_stdout,"\n");
  d = (char *)0x0;
  pcVar4 = mp_encode_binl_safe((char *)0x0,(ptrdiff_t *)&d,0x10000);
  _ok((uint)(d == (char *)0xfffffffffffffffb),"-sz == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "size after mp_encode_binl_safe(NULL, &sz)");
  _ok((uint)(pcVar4 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "mp_encode_binl_safe(NULL, &sz)");
  d = (char *)0x5;
  pcVar4 = mp_encode_binl_safe(data,(ptrdiff_t *)&d,0x10000);
  _ok((uint)(d == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "size after mp_encode_binl_safe(buf, &sz)");
  _ok((uint)((long)pcVar4 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "len of mp_encode_binl_safe(buf, &sz)");
  iVar2 = memcmp(data,anon_var_dwarf_3e5f,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc6\\x00\\x01\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "mp_encode_binl_safe(buf, &sz)");
  d = (char *)0x4;
  pcVar4 = mp_encode_binl_safe(data,(ptrdiff_t *)&d,0x10000);
  _ok((uint)(d == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "size after mp_encode_binl_safe(buf, &sz) overflow");
  _ok((uint)(pcVar4 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "mp_encode_binl_safe(buf, &sz) overflow");
  pcVar4 = mp_encode_binl_safe(data,(ptrdiff_t *)0x0,0x10000);
  _ok((uint)((long)pcVar4 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "len of mp_encode_binl_safe(buf, NULL)");
  iVar2 = memcmp(data,anon_var_dwarf_3e5f,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc6\\x00\\x01\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1e3,
      "mp_encode_binl_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_binls");
  iVar2 = check_plan();
  return iVar2;
}

Assistant:

static int
test_binls(void)
{
	plan(13*6 + 9);
	header();

	test_binl(0x00U, "\xc4\x00", 2);
	test_binl(0x01U, "\xc4\x01", 2);
	test_binl(0x1eU, "\xc4\x1e", 2);
	test_binl(0x1fU, "\xc4\x1f", 2);

	test_binl(0x20U, "\xc4\x20", 2);
	test_binl(0xfeU, "\xc4\xfe", 2);
	test_binl(0xffU, "\xc4\xff", 2);

	test_binl(0x0100U, "\xc5\x01\x00", 3);
	test_binl(0xfffeU, "\xc5\xff\xfe", 3);
	test_binl(0xffffU, "\xc5\xff\xff", 3);

	test_binl(0x00010000U, "\xc6\x00\x01\x00\x00", 5);
	test_binl(0xfffffffeU, "\xc6\xff\xff\xff\xfe", 5);
	test_binl(0xffffffffU, "\xc6\xff\xff\xff\xff", 5);

	test_binl_safe(0x00010000U, "\xc6\x00\x01\x00\x00", 5);

	footer();
	return check_plan();
}